

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void codebinNoK(FuncState *fs,BinOpr opr,expdesc *e1,expdesc *e2,int flip,int line)

{
  anon_union_8_6_45a55102_for_u aVar1;
  anon_union_8_6_45a55102_for_u aVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  expkind eVar7;
  undefined4 uVar8;
  expdesc temp;
  
  if (flip != 0) {
    iVar5 = e1->t;
    iVar6 = e1->f;
    eVar7 = e1->k;
    uVar8 = *(undefined4 *)&e1->field_0x4;
    aVar1 = e1->u;
    iVar3 = e2->f;
    e1->t = e2->t;
    e1->f = iVar3;
    uVar4 = *(undefined4 *)&e2->field_0x4;
    aVar2 = e2->u;
    e1->k = e2->k;
    *(undefined4 *)&e1->field_0x4 = uVar4;
    e1->u = aVar2;
    e2->t = iVar5;
    e2->f = iVar6;
    e2->k = eVar7;
    *(undefined4 *)&e2->field_0x4 = uVar8;
    e2->u = aVar1;
  }
  codebinexpval(fs,opr,e1,e2,line);
  return;
}

Assistant:

static void codebinNoK (FuncState *fs, BinOpr opr,
                        expdesc *e1, expdesc *e2, int flip, int line) {
  if (flip)
    swapexps(e1, e2);  /* back to original order */
  codebinexpval(fs, opr, e1, e2, line);  /* use standard operators */
}